

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_string_vector.h
# Opt level: O0

void __thiscall
PlainStringVector<128UL,_4096UL>::add(PlainStringVector<128UL,_4096UL> *this,string *str)

{
  pointer pvVar1;
  size_type sVar2;
  value_type local_29;
  value_type local_28;
  pointer local_20;
  string *local_18;
  string *str_local;
  PlainStringVector<128UL,_4096UL> *this_local;
  
  local_18 = str;
  str_local = (string *)this;
  PlainVector<char_*,_129UL>::pop_back(&this->items_);
  pvVar1 = PlainString<4224UL>::c_str(&this->data_);
  sVar2 = PlainString<4224UL>::size(&this->data_);
  local_20 = pvVar1 + sVar2;
  PlainVector<char_*,_129UL>::push_back(&this->items_,&local_20);
  local_28 = (value_type)0x0;
  PlainVector<char_*,_129UL>::push_back(&this->items_,&local_28);
  PlainString<4224UL>::operator+=(&this->data_,local_18);
  local_29 = '\0';
  PlainString<4224UL>::operator+=(&this->data_,&local_29);
  return;
}

Assistant:

void add(const std::string &str) {
        items_.pop_back();
        items_.push_back(data_.c_str() + data_.size());
        items_.push_back(nullptr);
        data_ += str;
        data_ += '\0';
    }